

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::string_t,duckdb::date_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool>
               (string_t *ldata,date_t *rdata,timestamp_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  undefined4 uVar1;
  ValidityMask *mask;
  undefined8 uVar2;
  string_t left;
  string_t left_00;
  bool bVar3;
  timestamp_t tVar4;
  idx_t iVar5;
  undefined8 *puVar6;
  SelectionVector *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  SelectionVector *in_R8;
  ulong in_R9;
  TemplatedValidityMask<unsigned_long> *in_stack_00000008;
  TemplatedValidityMask<unsigned_long> *in_stack_00000010;
  date_t rentry_1;
  string_t lentry_1;
  idx_t i_1;
  date_t rentry;
  string_t lentry;
  idx_t rindex;
  idx_t lindex;
  idx_t i;
  idx_t in_stack_ffffffffffffff28;
  long lVar7;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  ValidityMask *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  timestamp_t in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  ulong local_90;
  ulong local_40;
  
  bVar3 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000008);
  if ((bVar3) && (bVar3 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000010), bVar3))
  {
    for (local_90 = 0; local_90 < in_R9; local_90 = local_90 + 1) {
      lVar7 = in_RDI;
      iVar5 = SelectionVector::get_index(in_RCX,local_90);
      puVar6 = (undefined8 *)(lVar7 + iVar5 * 0x10);
      mask = (ValidityMask *)*puVar6;
      uVar2 = puVar6[1];
      lVar7 = in_RSI;
      iVar5 = SelectionVector::get_index(in_R8,local_90);
      uVar1 = *(undefined4 *)(lVar7 + iVar5 * 4);
      left_00.value._8_4_ = in_stack_ffffffffffffff58;
      left_00.value._0_8_ = in_stack_ffffffffffffff50.value;
      left_00.value._12_4_ = uVar1;
      in_stack_ffffffffffffff50 =
           BinaryStandardOperatorWrapper::
           Operation<bool,duckdb::DateTruncBinaryOperator,duckdb::string_t,duckdb::date_t,duckdb::timestamp_t>
                     (SUB81((ulong)uVar2 >> 0x18,0),left_00,(date_t)(int32_t)((ulong)uVar2 >> 0x20),
                      mask,CONCAT44(uVar1,in_stack_ffffffffffffff38));
      *(int64_t *)(in_RDX + local_90 * 8) = in_stack_ffffffffffffff50.value;
    }
  }
  else {
    for (local_40 = 0; local_40 < in_R9; local_40 = local_40 + 1) {
      SelectionVector::get_index(in_RCX,local_40);
      SelectionVector::get_index(in_R8,local_40);
      bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        ((TemplatedValidityMask<unsigned_long> *)
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                         (idx_t)in_stack_ffffffffffffff30);
      if ((bVar3) &&
         (bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            ((TemplatedValidityMask<unsigned_long> *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                             (idx_t)in_stack_ffffffffffffff30), bVar3)) {
        left.value._8_4_ = in_stack_ffffffffffffff58;
        left.value._0_8_ = in_stack_ffffffffffffff50.value;
        left.value._12_4_ = in_stack_ffffffffffffff5c;
        tVar4 = BinaryStandardOperatorWrapper::
                Operation<bool,duckdb::DateTruncBinaryOperator,duckdb::string_t,duckdb::date_t,duckdb::timestamp_t>
                          (SUB81((ulong)in_stack_ffffffffffffff48 >> 0x18,0),left,
                           (date_t)(int32_t)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                           in_stack_ffffffffffffff40,
                           CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        *(int64_t *)(in_RDX + local_40 * 8) = tVar4.value;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}